

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

string * __thiscall
pbrt::StringPrintf<char*&>(string *__return_storage_ptr__,pbrt *this,char *fmt,char **args)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<char*&>(__return_storage_ptr__,(char *)this,(char **)fmt);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StringPrintf(const char *fmt, Args &&... args) {
    std::string ret;
    detail::stringPrintfRecursive(&ret, fmt, std::forward<Args>(args)...);
    return ret;
}